

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void TPZCompElHCurl<pzshape::TPZShapeQuad>::TransformCurl<3>
               (TPZFMatrix<double> *curlphiref,REAL detjac,TPZFMatrix<double> *jacobian,
               TPZFMatrix<double> *curlphi)

{
  long *in_RDX;
  double in_XMM0_Qa;
  TPZFMatrix<double> *A;
  TPZFMatrix<double> *in_stack_ffffffffffffff40;
  TPZFMatrix<double> *in_stack_ffffffffffffff80;
  TPZFMatrix<double> *in_stack_ffffffffffffff88;
  
  A = (TPZFMatrix<double> *)&stack0xffffffffffffff50;
  TPZFMatrix<double>::operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  TPZFMatrix<double>::operator=(in_stack_ffffffffffffff40,A);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bddaf3);
  (**(code **)(*in_RDX + 0x130))(1.0 / in_XMM0_Qa);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformCurl(const TPZFMatrix<REAL> &curlphiref,
                                           const REAL detjac,
                                           const TPZFMatrix<REAL> &jacobian,
                                           TPZFMatrix<REAL> &curlphi)
{
    if constexpr(TDIM==3){
        curlphi = jacobian * curlphiref;
        curlphi *= 1./detjac;
    }else {
        curlphi = curlphiref;
        curlphi *= 1./detjac;
    }
}